

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Glucose::Solver::relocAll(Solver *this,ClauseAllocator *to)

{
  ClauseAllocator *this_00;
  uint uVar1;
  VarData *pVVar2;
  uint *puVar3;
  lbool *plVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  byte bVar10;
  vec<Glucose::Solver::Watcher> *pvVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll(&this->watches);
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll(&this->watchesBin);
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll(&this->unaryWatches);
  if (0 < (this->vardata).sz) {
    this_00 = &this->ca;
    lVar6 = 0;
    do {
      lVar14 = 0;
      do {
        lVar13 = lVar14 + lVar6 * 2;
        pvVar11 = (this->watches).occs.data;
        if (0 < pvVar11[lVar13].sz) {
          pvVar11 = pvVar11 + lVar13;
          lVar12 = 0;
          lVar15 = 0;
          do {
            ClauseAllocator::reloc(this_00,(CRef *)((long)&pvVar11->data->cref + lVar12),to);
            lVar15 = lVar15 + 1;
            lVar12 = lVar12 + 8;
          } while (lVar15 < pvVar11->sz);
        }
        pvVar11 = (this->watchesBin).occs.data;
        if (0 < pvVar11[lVar13].sz) {
          pvVar11 = pvVar11 + lVar13;
          lVar12 = 0;
          lVar15 = 0;
          do {
            ClauseAllocator::reloc(this_00,(CRef *)((long)&pvVar11->data->cref + lVar12),to);
            lVar15 = lVar15 + 1;
            lVar12 = lVar12 + 8;
          } while (lVar15 < pvVar11->sz);
        }
        pvVar11 = (this->unaryWatches).occs.data;
        if (0 < pvVar11[lVar13].sz) {
          pvVar11 = pvVar11 + lVar13;
          lVar13 = 0;
          lVar12 = 0;
          do {
            ClauseAllocator::reloc(this_00,(CRef *)((long)&pvVar11->data->cref + lVar13),to);
            lVar12 = lVar12 + 1;
            lVar13 = lVar13 + 8;
          } while (lVar12 < pvVar11->sz);
        }
        bVar16 = lVar14 == 0;
        lVar14 = lVar14 + 1;
      } while (bVar16);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->vardata).sz);
  }
  if (0 < (this->trail).sz) {
    lVar6 = 0;
    do {
      pVVar2 = (this->vardata).data;
      iVar5 = (this->trail).data[lVar6].x >> 1;
      uVar1 = pVVar2[iVar5].reason;
      uVar7 = (ulong)uVar1;
      if (uVar7 != 0xffffffff) {
        puVar3 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
        if ((char)*(undefined8 *)(puVar3 + uVar7) < '\0') {
LAB_00115c7c:
          ClauseAllocator::reloc(&this->ca,&pVVar2[iVar5].reason,to);
        }
        else {
          iVar9 = (int)puVar3[uVar7 + 3] >> 1;
          bVar10 = (byte)puVar3[uVar7 + 3] & 1;
          if ((int)((ulong)*(undefined8 *)(puVar3 + uVar7) >> 0x20) < 3) {
            plVar4 = (this->assigns).data;
            if (((plVar4[iVar9].value == bVar10) && (pVVar2[iVar9].reason != 0xffffffff)) &&
               (pVVar2[iVar9].reason == uVar1)) goto LAB_00115c7c;
            iVar9 = (int)puVar3[uVar7 + 4] >> 1;
            if (plVar4[iVar9].value == ((byte)puVar3[uVar7 + 4] & 1)) {
              uVar8 = pVVar2[iVar9].reason;
              goto LAB_00115c73;
            }
          }
          else if ((this->assigns).data[iVar9].value == bVar10) {
            uVar8 = pVVar2[iVar9].reason;
LAB_00115c73:
            if ((uVar8 != 0xffffffff) && (uVar8 == uVar1)) goto LAB_00115c7c;
          }
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->trail).sz);
  }
  if (0 < (this->learnts).sz) {
    lVar14 = 0;
    lVar6 = 0;
    do {
      ClauseAllocator::reloc(&this->ca,(CRef *)((long)(this->learnts).data + lVar14),to);
      lVar6 = lVar6 + 1;
      lVar14 = lVar14 + 4;
    } while (lVar6 < (this->learnts).sz);
  }
  if (0 < (this->permanentLearnts).sz) {
    lVar14 = 0;
    lVar6 = 0;
    do {
      ClauseAllocator::reloc(&this->ca,(CRef *)((long)(this->permanentLearnts).data + lVar14),to);
      lVar6 = lVar6 + 1;
      lVar14 = lVar14 + 4;
    } while (lVar6 < (this->permanentLearnts).sz);
  }
  if (0 < (this->clauses).sz) {
    lVar14 = 0;
    lVar6 = 0;
    do {
      ClauseAllocator::reloc(&this->ca,(CRef *)((long)(this->clauses).data + lVar14),to);
      lVar6 = lVar6 + 1;
      lVar14 = lVar14 + 4;
    } while (lVar6 < (this->clauses).sz);
  }
  if (0 < (this->unaryWatchedClauses).sz) {
    lVar14 = 0;
    lVar6 = 0;
    do {
      ClauseAllocator::reloc(&this->ca,(CRef *)((long)(this->unaryWatchedClauses).data + lVar14),to)
      ;
      lVar6 = lVar6 + 1;
      lVar14 = lVar14 + 4;
    } while (lVar6 < (this->unaryWatchedClauses).sz);
  }
  return;
}

Assistant:

void Solver::relocAll(ClauseAllocator &to) {
    // All watchers:
    // for (int i = 0; i < watches.size(); i++)
    watches.cleanAll();
    watchesBin.cleanAll();
    unaryWatches.cleanAll();
    for(int v = 0; v < nVars(); v++)
        for(int s = 0; s < 2; s++) {
            Lit p = mkLit(v, s);
            // printf(" >>> RELOCING: %s%d\n", sign(p)?"-":"", var(p)+1);
            vec <Watcher> &ws = watches[p];
            for(int j = 0; j < ws.size(); j++)
                ca.reloc(ws[j].cref, to);
            vec <Watcher> &ws2 = watchesBin[p];
            for(int j = 0; j < ws2.size(); j++)
                ca.reloc(ws2[j].cref, to);
            vec <Watcher> &ws3 = unaryWatches[p];
            for(int j = 0; j < ws3.size(); j++)
                ca.reloc(ws3[j].cref, to);
        }

    // All reasons:
    //
    for(int i = 0; i < trail.size(); i++) {
        Var v = var(trail[i]);

        if(reason(v) != CRef_Undef && (ca[reason(v)].reloced() || locked(ca[reason(v)])))
            ca.reloc(vardata[v].reason, to);
    }

    // All learnt:
    //
    for(int i = 0; i < learnts.size(); i++)
        ca.reloc(learnts[i], to);

    for(int i = 0; i < permanentLearnts.size(); i++)
        ca.reloc(permanentLearnts[i], to);

    // All original:
    //
    for(int i = 0; i < clauses.size(); i++)
        ca.reloc(clauses[i], to);

    for(int i = 0; i < unaryWatchedClauses.size(); i++)
        ca.reloc(unaryWatchedClauses[i], to);
}